

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile.hpp
# Opt level: O1

void __thiscall CompoundFile::File::initialize(File *this,string *fileName)

{
  Header *this_00;
  SAT *sat;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar3;
  istream *stream_00;
  pointer pcVar4;
  mapped_type *pmVar5;
  Exception *this_01;
  MSAT msat;
  Stream stream;
  Directory local_198;
  int32_t local_15c;
  Directory local_158;
  MSAT local_120;
  undefined1 local_f8 [40];
  pointer local_d0;
  pointer local_c8;
  pointer local_b8;
  pointer local_88;
  pointer local_78;
  Directory local_68;
  
  stream_00 = this->m_stream;
  if (*(int *)(stream_00 + *(long *)(*(long *)stream_00 + -0x18) + 0x20) == 0) {
    this_00 = &this->m_header;
    Header::load(this_00,stream_00);
    local_120.m_stream = this->m_stream;
    local_120.m_msat.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_120.m_msat.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_120.m_msat.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_120.m_header = this_00;
    MSAT::loadMSAT(&local_120);
    MSAT::buildSAT((SAT *)local_f8,&local_120);
    sat = &this->m_sat;
    std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::_M_move_assign
              (&sat->m_sat,local_f8);
    if ((pointer)local_f8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
    }
    loadSSAT((SAT *)local_f8,this_00,this->m_stream,sat);
    std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::_M_move_assign
              (&(this->m_ssat).m_sat,local_f8);
    if ((pointer)local_f8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
    }
    local_198.m_name._M_dataplus._M_p._0_4_ = (this->m_header).m_dirStreamSecID.m_id;
    Stream::Stream((Stream *)local_f8,this_00,sat,(SecID *)&local_198,this->m_stream);
    paVar1 = &local_198.m_name.field_2;
    local_198.m_name._M_string_length = 0;
    local_198.m_name.field_2._M_local_buf[0] = L'\0';
    local_198.m_type = Empty;
    local_198.m_secID.m_id = -2;
    local_198.m_streamSize = 0;
    local_198.m_rightChild = -1;
    local_198.m_leftChild = -1;
    local_198.m_rootNode = -1;
    local_198.m_name._M_dataplus._M_p = (pointer)paVar1;
    Directory::load(&local_198,(Stream *)local_f8);
    (this->m_shortStreamFirstSector).m_id = local_198.m_secID.m_id;
    Stream::seek((Stream *)local_f8,local_198.m_rootNode << 7,FromBeginning);
    paVar2 = &local_158.m_name.field_2;
    local_158.m_name._M_string_length = 0;
    local_158.m_name.field_2._M_local_buf[0] = L'\0';
    local_158.m_type = Empty;
    local_158.m_secID.m_id = -2;
    local_158.m_streamSize = 0;
    local_158.m_rightChild = -1;
    local_158.m_leftChild = -1;
    local_158.m_rootNode = -1;
    local_158.m_name._M_dataplus._M_p = (pointer)paVar2;
    Directory::load(&local_158,(Stream *)local_f8);
    local_15c = local_198.m_rootNode;
    pmVar5 = std::
             map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
             ::operator[](&this->m_dirs,&local_15c);
    std::__cxx11::wstring::_M_assign((wstring *)pmVar5);
    pmVar5->m_leftChild = local_158.m_leftChild;
    pmVar5->m_rootNode = local_158.m_rootNode;
    pmVar5->m_type = local_158.m_type;
    (pmVar5->m_secID).m_id = local_158.m_secID.m_id;
    pmVar5->m_streamSize = local_158.m_streamSize;
    pmVar5->m_rightChild = local_158.m_rightChild;
    paVar3 = &local_68.m_name.field_2;
    local_68.m_name._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::wstring::_M_construct<wchar_t*>
              ((wstring *)&local_68,local_158.m_name._M_dataplus._M_p,
               local_158.m_name._M_dataplus._M_p + local_158.m_name._M_string_length);
    local_68.m_leftChild = local_158.m_leftChild;
    local_68.m_rootNode = local_158.m_rootNode;
    local_68.m_type = local_158.m_type;
    local_68.m_secID.m_id = local_158.m_secID.m_id;
    local_68.m_streamSize = local_158.m_streamSize;
    local_68.m_rightChild = local_158.m_rightChild;
    loadChildDirectories(&this->m_dirs,&local_68,(Stream *)local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_68.m_name._M_dataplus._M_p != paVar3) {
      operator_delete(local_68.m_name._M_dataplus._M_p,
                      local_68.m_name.field_2._M_allocated_capacity * 4 + 4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_158.m_name._M_dataplus._M_p != paVar2) {
      operator_delete(local_158.m_name._M_dataplus._M_p,
                      CONCAT44(local_158.m_name.field_2._M_local_buf[1],
                               local_158.m_name.field_2._M_local_buf[0]) * 4 + 4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_198.m_name._M_dataplus._M_p != paVar1) {
      operator_delete(local_198.m_name._M_dataplus._M_p,
                      CONCAT44(local_198.m_name.field_2._M_local_buf[1],
                               local_198.m_name.field_2._M_local_buf[0]) * 4 + 4);
    }
    local_f8._0_8_ = &PTR__Stream_0010fd38;
    if (local_88 != (pointer)0x0) {
      operator_delete(local_88,(long)local_78 - (long)local_88);
    }
    if (local_c8 != (pointer)0x0) {
      operator_delete(local_c8,(long)local_b8 - (long)local_c8);
    }
    if ((pointer)local_f8._24_8_ != (pointer)0x0) {
      operator_delete((void *)local_f8._24_8_,(long)local_d0 - local_f8._24_8_);
    }
    if (local_120.m_msat.
        super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.m_msat.
                      super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_120.m_msat.
                            super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_120.m_msat.
                            super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  this_01 = (Exception *)__cxa_allocate_exception(0x30);
  local_198.m_name._M_dataplus._M_p = (pointer)&local_198.m_name.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_198,L"Unable to open file : ",L"");
  pcVar4 = (fileName->_M_dataplus)._M_p;
  local_158.m_name._M_dataplus._M_p = (pointer)&local_158.m_name.field_2;
  std::__cxx11::wstring::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((wstring *)&local_158,pcVar4,pcVar4 + fileName->_M_string_length);
  std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 local_f8,&local_198.m_name,&local_158.m_name);
  Exception::Exception(this_01,(wstring *)local_f8);
  __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline void
File::initialize( const std::string & fileName )
{
	if( m_stream.good() )
	{
		m_header.load( m_stream );

		MSAT msat( m_header, m_stream );
		m_sat = msat.buildSAT();

		m_ssat = loadSSAT( m_header, m_stream, m_sat );

		Stream stream( m_header, m_sat, m_header.dirStreamSecID(), m_stream );

		Directory root;
		root.load( stream );

		m_shortStreamFirstSector = root.streamSecID();

		stream.seek( root.rootNode() * dirRecordSize, Stream::FromBeginning );

		Directory rootEntry;
		rootEntry.load( stream );

		m_dirs[ root.rootNode() ] = rootEntry;

		loadChildDirectories( m_dirs, rootEntry, stream );
	}
	else
		throw Exception( std::wstring( L"Unable to open file : " ) +
			std::wstring( fileName.cbegin(), fileName.cend() ) );
}